

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStringEq(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Nullability NVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  StringEq *pSVar5;
  Type local_38;
  Type local_30;
  
  if (type.id != 2) {
    __assert_fail("type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xe9b,"Expression *wasm::TranslateToFuzzReader::makeStringEq(Type)");
  }
  bVar1 = Random::oneIn(&this->random,2);
  if (bVar1) {
    NVar2 = getNullability(this);
    Type::Type(&local_38,(HeapType)0x50,NVar2,Inexact);
    pEVar3 = make(this,local_38);
    NVar2 = getNullability(this);
    Type::Type(&local_30,(HeapType)0x50,NVar2,Inexact);
    pEVar4 = make(this,local_30);
    pSVar5 = Builder::makeStringEq(&this->builder,StringEqEqual,pEVar3,pEVar4);
    return (Expression *)pSVar5;
  }
  pEVar3 = makeTrappingRefUse(this,(HeapType)0x50);
  pEVar4 = makeTrappingRefUse(this,(HeapType)0x50);
  pSVar5 = Builder::makeStringEq(&this->builder,StringEqCompare,pEVar3,pEVar4);
  return (Expression *)pSVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeStringEq(Type type) {
  assert(type == Type::i32);

  if (oneIn(2)) {
    auto* left = make(Type(HeapType::string, getNullability()));
    auto* right = make(Type(HeapType::string, getNullability()));
    return builder.makeStringEq(StringEqEqual, left, right);
  }

  // string.compare may trap if the either input is null.
  auto* left = makeTrappingRefUse(HeapType::string);
  auto* right = makeTrappingRefUse(HeapType::string);
  return builder.makeStringEq(StringEqCompare, left, right);
}